

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall
QComboBoxPrivate::rowsRemoved(QComboBoxPrivate *this,QModelIndex *parent,int param_2,int param_3)

{
  QWidget *this_00;
  QAbstractItemModel *pQVar1;
  QLineEdit *this_01;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  Data *local_48;
  char16_t *local_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar2 = ::operator!=(parent,&this->root);
  if (!bVar2) {
    if (this->sizeAdjustPolicy == AdjustToContents) {
      (this->sizeHint).wd = -1;
      (this->sizeHint).ht = -1;
      adjustComboBoxSize(this);
      QWidget::updateGeometry(this_00);
    }
    pQVar1 = this->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_48,&this->root);
    iVar4 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1);
    if (iVar4 == 0) {
      local_48 = (Data *)0xffffffffffffffff;
      local_40 = (char16_t *)0x0;
      tStack_38.ptr = (QAbstractItemModel *)0x0;
      setCurrentIndex(this,(QModelIndex *)&local_48);
    }
    else {
      iVar4 = QPersistentModelIndex::row();
      if (iVar4 != this->indexBeforeChange) {
        cVar3 = QPersistentModelIndex::isValid();
        if (cVar3 == '\0') {
          iVar4 = QComboBox::count((QComboBox *)this_00);
          if (iVar4 != 0) {
            iVar5 = QComboBox::count((QComboBox *)this_00);
            iVar4 = 0;
            if (0 < this->indexBeforeChange) {
              iVar4 = this->indexBeforeChange;
            }
            if (iVar5 + -1 < iVar4) {
              iVar4 = iVar5 + -1;
            }
            QComboBox::setCurrentIndex((QComboBox *)this_00,iVar4);
            goto LAB_003b1284;
          }
        }
        this_01 = this->lineEdit;
        if (this_01 != (QLineEdit *)0x0) {
          iVar4 = QPersistentModelIndex::row();
          QComboBox::itemText((QString *)&local_48,(QComboBox *)this_00,iVar4);
          QLineEdit::setText(this_01,(QString *)&local_48);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
          updateLineEditGeometry(this);
        }
        QWidget::update(this_00);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QModelIndex *)&local_48,&this->currentIndex);
        emitCurrentIndexChanged(this,(QModelIndex *)&local_48);
      }
    }
  }
LAB_003b1284:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::rowsRemoved(const QModelIndex &parent, int /*start*/, int /*end*/)
{
    Q_Q(QComboBox);
    if (parent != root)
        return;

    if (sizeAdjustPolicy == QComboBox::AdjustToContents) {
        sizeHint = QSize();
        adjustComboBoxSize();
        q->updateGeometry();
    }

    // model has removed the last row
    if (model->rowCount(root) == 0) {
        setCurrentIndex(QModelIndex());
        return;
    }

    // model has changed the currentIndex
    if (currentIndex.row() != indexBeforeChange) {
        if (!currentIndex.isValid() && q->count()) {
            q->setCurrentIndex(qMin(q->count() - 1, qMax(indexBeforeChange, 0)));
            return;
        }
        if (lineEdit) {
            lineEdit->setText(q->itemText(currentIndex.row()));
            updateLineEditGeometry();
        }
        q->update();
        emitCurrentIndexChanged(currentIndex);
    }
}